

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  undefined4 in_register_00000034;
  uint64_t *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int *piVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int local_5c;
  secp256k1_scalar s;
  
  puVar6 = (uint64_t *)CONCAT44(in_register_00000034,len);
  iVar5 = (int)a;
  iVar12 = 0;
  memset(wnaf,0,0x400);
  s.d[2] = puVar6[2];
  s.d[3] = puVar6[3];
  s.d[0] = *puVar6;
  s.d[1] = puVar6[1];
  if ((long)puVar6[3] < 0) {
    secp256k1_scalar_negate(&s,&s);
    local_5c = -1;
  }
  else {
    local_5c = 1;
  }
  uVar8 = 0;
  uVar9 = 0xffffffff;
  do {
    iVar2 = iVar12 + -0x100;
    iVar10 = 0x100 - iVar12;
    iVar14 = iVar12 + -1;
    piVar11 = wnaf + iVar12;
    while( true ) {
      uVar1 = iVar2 + 0x100;
      if (0xff < (int)uVar1) {
        return uVar9 + 1;
      }
      uVar7 = uVar1 >> 6;
      bVar4 = (byte)uVar1 & 0x3f;
      uVar13 = (uint)(s.d[uVar7] >> bVar4);
      if ((uVar13 & 1) != uVar8) break;
      iVar12 = iVar12 + 1;
      iVar2 = iVar2 + 1;
      iVar10 = iVar10 + -1;
      iVar14 = iVar14 + 1;
      piVar11 = piVar11 + 1;
    }
    iVar3 = -iVar2;
    if (iVar5 <= -iVar2) {
      iVar3 = iVar5;
    }
    iVar2 = iVar10;
    if (iVar5 < iVar10) {
      iVar2 = iVar5;
    }
    if ((uint)(iVar2 + iVar14) >> 6 != uVar7) {
      uVar13 = uVar13 | (uint)(s.d[(ulong)uVar7 + 1] << (-bVar4 & 0x3f));
    }
    uVar9 = uVar8 + (uVar13 & ~(uint)(-1L << ((byte)iVar3 & 0x3f)));
    uVar8 = (uint)((uVar9 >> (iVar5 - 1U & 0x1f) & 1) != 0);
    *piVar11 = (uVar9 - (uVar8 << ((byte)a & 0x1f))) * local_5c;
    if (iVar5 < iVar10) {
      iVar10 = iVar5;
    }
    iVar12 = iVar10 + iVar12;
    uVar9 = uVar1;
  } while( true );
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    s = *a;
    if (secp256k1_scalar_get_bits(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    CHECK(carry == 0);
    while (bit < 256) {
        CHECK(secp256k1_scalar_get_bits(&s, bit++, 1) == 0);
    }
#endif
    return last_set_bit + 1;
}